

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::sectionEnded(CompactReporter *this,SectionStats *_sectionStats)

{
  bool bVar1;
  ostream *poVar2;
  string local_40;
  double local_20;
  double dur;
  SectionStats *_sectionStats_local;
  CompactReporter *this_local;
  
  local_20 = _sectionStats->durationInSeconds;
  dur = (double)_sectionStats;
  _sectionStats_local = (SectionStats *)this;
  bVar1 = shouldShowDuration((this->super_StreamingReporterBase).super_ReporterBase.
                             super_IEventListener.m_config,local_20);
  if (bVar1) {
    poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    getFormattedDuration_abi_cxx11_(&local_40,(Catch *)_sectionStats,local_20);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    poVar2 = std::operator<<(poVar2," s: ");
    poVar2 = std::operator<<(poVar2,(string *)dur);
    poVar2 = std::operator<<(poVar2,'\n');
    std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void CompactReporter::sectionEnded(SectionStats const& _sectionStats) {
            double dur = _sectionStats.durationInSeconds;
            if ( shouldShowDuration( *m_config, dur ) ) {
                m_stream << getFormattedDuration( dur ) << " s: " << _sectionStats.sectionInfo.name << '\n' << std::flush;
            }
        }